

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::setSolution(Highs *this,HighsSolution *solution)

{
  HighsSolution *solution_00;
  int iVar1;
  HighsStatus HVar2;
  HighsStatus HVar3;
  size_type sVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  allocator local_129;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *local_128;
  HighsLp *local_120;
  HighsSolution *local_118;
  string local_110;
  HighsLogOptions local_f0;
  HighsLogOptions local_90;
  
  uVar5 = (ulong)(this->model_).lp_.num_col_;
  if ((long)uVar5 < 1) {
    bVar6 = false;
  }
  else {
    bVar6 = uVar5 <= (ulong)((long)(solution->col_value).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(solution->col_value).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 3);
  }
  iVar1 = (this->model_).lp_.num_row_;
  if ((long)iVar1 < 1) {
    bVar7 = false;
  }
  else {
    bVar7 = (ulong)(long)iVar1 <=
            (ulong)((long)(solution->row_dual).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(solution->row_dual).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3);
  }
  if (bVar6 || bVar7) {
    invalidateSolverData(this);
    HVar3 = kOk;
  }
  else {
    HVar3 = kError;
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "setSolution: User solution is rejected due to mismatch between size of col_value and row_dual vectors (%d, %d) and number of columns and rows in the model (%d, %d)\n"
                 ,(ulong)((long)(solution->col_value).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(solution->col_value).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3,
                 (ulong)((long)(solution->row_dual).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(solution->row_dual).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3,uVar5,iVar1);
  }
  local_120 = &(this->model_).lp_;
  if (bVar6) {
    solution_00 = &this->solution_;
    std::vector<double,_std::allocator<double>_>::operator=
              (&(this->solution_).col_value,&solution->col_value);
    sVar4 = (size_type)(this->model_).lp_.num_row_;
    local_118 = solution_00;
    if (0 < (long)sVar4) {
      local_128 = &local_90.user_callback;
      std::vector<double,_std::allocator<double>_>::resize(&(this->solution_).row_value,sVar4);
      HighsSparseMatrix::ensureColwise(&(this->model_).lp_.a_matrix_);
      HighsLogOptions::HighsLogOptions
                (&local_90,&(this->options_).super_HighsOptionsStruct.log_options);
      HVar2 = calculateRowValuesQuad(local_120,solution_00,-1);
      std::__cxx11::string::string((string *)&local_110,"calculateRowValuesQuad",&local_129);
      HVar3 = interpretCallStatus(&local_90,HVar2,HVar3,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::_Function_base::~_Function_base(&local_90.user_callback.super__Function_base);
      if (HVar3 == kError) {
        return kError;
      }
    }
    local_118->value_valid = true;
  }
  if (bVar7) {
    std::vector<double,_std::allocator<double>_>::operator=
              (&(this->solution_).row_dual,&solution->row_dual);
    sVar4 = (size_type)(this->model_).lp_.num_col_;
    if (0 < (long)sVar4) {
      std::vector<double,_std::allocator<double>_>::resize(&(this->solution_).col_dual,sVar4);
      HighsSparseMatrix::ensureColwise(&(this->model_).lp_.a_matrix_);
      HighsLogOptions::HighsLogOptions
                (&local_f0,&(this->options_).super_HighsOptionsStruct.log_options);
      HVar2 = calculateColDualsQuad(local_120,&this->solution_);
      std::__cxx11::string::string((string *)&local_110,"calculateColDuals",&local_129);
      HVar3 = interpretCallStatus(&local_f0,HVar2,HVar3,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::_Function_base::~_Function_base(&local_f0.user_callback.super__Function_base);
      if (HVar3 == kError) {
        return kError;
      }
    }
    (this->solution_).dual_valid = true;
  }
  HVar3 = returnFromHighs(this,HVar3);
  return HVar3;
}

Assistant:

HighsStatus Highs::setSolution(const HighsSolution& solution) {
  HighsStatus return_status = HighsStatus::kOk;
  // Determine whether a new solution will be defined. If so,
  // the old solution and any basis are cleared
  const bool new_primal_solution =
      model_.lp_.num_col_ > 0 &&
      solution.col_value.size() >= static_cast<size_t>(model_.lp_.num_col_);
  const bool new_dual_solution =
      model_.lp_.num_row_ > 0 &&
      solution.row_dual.size() >= static_cast<size_t>(model_.lp_.num_row_);
  const bool new_solution = new_primal_solution || new_dual_solution;

  if (new_solution) {
    invalidateSolverData();
  } else {
    // Solution is rejected, so give a logging message and error
    // return
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "setSolution: User solution is rejected due to mismatch between "
        "size of col_value and row_dual vectors (%d, %d) and number "
        "of columns and rows in the model (%d, %d)\n",
        int(solution.col_value.size()), int(solution.row_dual.size()),
        int(model_.lp_.num_col_), int(model_.lp_.num_row_));
    return_status = HighsStatus::kError;
  }

  if (new_primal_solution) {
    solution_.col_value = solution.col_value;
    if (model_.lp_.num_row_ > 0) {
      // Worth computing the row values
      solution_.row_value.resize(model_.lp_.num_row_);
      // Matrix must be column-wise
      model_.lp_.a_matrix_.ensureColwise();
      return_status = interpretCallStatus(
          options_.log_options, calculateRowValuesQuad(model_.lp_, solution_),
          return_status, "calculateRowValuesQuad");
      if (return_status == HighsStatus::kError) return return_status;
    }
    solution_.value_valid = true;
  }
  if (new_dual_solution) {
    solution_.row_dual = solution.row_dual;
    if (model_.lp_.num_col_ > 0) {
      // Worth computing the column duals
      solution_.col_dual.resize(model_.lp_.num_col_);
      // Matrix must be column-wise
      model_.lp_.a_matrix_.ensureColwise();
      return_status = interpretCallStatus(
          options_.log_options, calculateColDualsQuad(model_.lp_, solution_),
          return_status, "calculateColDuals");
      if (return_status == HighsStatus::kError) return return_status;
    }
    solution_.dual_valid = true;
  }
  return returnFromHighs(return_status);
}